

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_disconnect(ENetPeer *peer,enet_uint32 data)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  ENetPeer *in_RDI;
  ENetProtocol command;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  byte bVar2;
  undefined1 in_stack_ffffffffffffffc3;
  undefined1 uVar3;
  undefined2 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffc6;
  undefined6 in_stack_ffffffffffffffca;
  ENetProtocol *in_stack_ffffffffffffffd0;
  ENetPeer *in_stack_ffffffffffffffd8;
  
  if ((((in_RDI->state != ENET_PEER_STATE_DISCONNECTING) &&
       (in_RDI->state != ENET_PEER_STATE_DISCONNECTED)) &&
      (in_RDI->state != ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT)) &&
     (in_RDI->state != ENET_PEER_STATE_ZOMBIE)) {
    enet_peer_reset_queues
              ((ENetPeer *)
               CONCAT26(in_stack_ffffffffffffffc6,
                        CONCAT24(in_stack_ffffffffffffffc4,
                                 CONCAT13(in_stack_ffffffffffffffc3,
                                          CONCAT12(in_stack_ffffffffffffffc2,
                                                   in_stack_ffffffffffffffc0)))));
    bVar2 = 4;
    uVar3 = 0xff;
    uVar1 = htonl(in_ESI);
    if ((in_RDI->state == ENET_PEER_STATE_CONNECTED) ||
       (in_RDI->state == ENET_PEER_STATE_DISCONNECT_LATER)) {
      bVar2 = bVar2 | 0x80;
    }
    else {
      bVar2 = bVar2 | 0x40;
    }
    enet_peer_queue_outgoing_command
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               (ENetPacket *)CONCAT62(in_stack_ffffffffffffffca,(short)(uVar1 >> 0x10)),
               CONCAT22((short)uVar1,in_stack_ffffffffffffffc4),CONCAT11(uVar3,bVar2));
    if ((in_RDI->state == ENET_PEER_STATE_CONNECTED) ||
       (in_RDI->state == ENET_PEER_STATE_DISCONNECT_LATER)) {
      enet_peer_on_disconnect(in_RDI);
      in_RDI->state = ENET_PEER_STATE_DISCONNECTING;
    }
    else {
      enet_host_flush((ENetHost *)0x107876);
      enet_peer_reset((ENetPeer *)0x107880);
    }
  }
  return;
}

Assistant:

void
enet_peer_disconnect (ENetPeer * peer, enet_uint32 data)
{
    ENetProtocol command;

    if (peer -> state == ENET_PEER_STATE_DISCONNECTING ||
        peer -> state == ENET_PEER_STATE_DISCONNECTED ||
        peer -> state == ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT ||
        peer -> state == ENET_PEER_STATE_ZOMBIE)
      return;

    enet_peer_reset_queues (peer);

    command.header.command = ENET_PROTOCOL_COMMAND_DISCONNECT;
    command.header.channelID = 0xFF;
    command.disconnect.data = ENET_HOST_TO_NET_32 (data);

    if (peer -> state == ENET_PEER_STATE_CONNECTED || peer -> state == ENET_PEER_STATE_DISCONNECT_LATER)
      command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    else
      command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;      
    
    enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);

    if (peer -> state == ENET_PEER_STATE_CONNECTED || peer -> state == ENET_PEER_STATE_DISCONNECT_LATER)
    {
        enet_peer_on_disconnect (peer);

        peer -> state = ENET_PEER_STATE_DISCONNECTING;
    }
    else
    {
        enet_host_flush (peer -> host);
        enet_peer_reset (peer);
    }
}